

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O2

void test_shifted_barcode2<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>
               (void)

{
  _List_node_base *__args;
  uint *__args_1;
  _Base_ptr p_Var1;
  bool bVar2;
  _Rb_tree_node_base *p_Var3;
  undefined1 *puVar4;
  _List_node_base *p_Var5;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_00;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_01;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_02;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_03;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_04;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_05;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_06;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_07;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars1;
  undefined4 local_600 [2];
  undefined8 local_5f8;
  shared_count sStack_5f0;
  undefined8 local_5e8;
  uint local_5e0 [2];
  undefined8 *local_5d8;
  char **local_5d0;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  reducedMatrix;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars2;
  char *local_570;
  char *local_568;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars3;
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_530;
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_518;
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_500;
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_4e8;
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_4d0;
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_4b8;
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_4a0;
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_488;
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_470;
  Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true>_>
  m;
  char *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  Gudhi::persistence_matrix::
  Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true>_>
  ::Matrix(&m,9,5);
  bars1._M_t._M_impl._0_8_ = 0;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  Gudhi::persistence_matrix::
  Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>
  ::insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            ((Insertion_return *)&local_470,
             (Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>
              *)&m,2,(initializer_list<std::pair<unsigned_int,_unsigned_int>_> *)&bars1,0);
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base(&local_470);
  bars1._M_t._M_impl._0_8_ = 0;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  Gudhi::persistence_matrix::
  Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>
  ::insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            ((Insertion_return *)&local_488,
             (Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>
              *)&m,3,(initializer_list<std::pair<unsigned_int,_unsigned_int>_> *)&bars1,0);
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base(&local_488);
  bars1._M_t._M_impl._0_8_ = 0;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  Gudhi::persistence_matrix::
  Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>
  ::insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            ((Insertion_return *)&local_4a0,
             (Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>
              *)&m,5,(initializer_list<std::pair<unsigned_int,_unsigned_int>_> *)&bars1,0);
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base(&local_4a0);
  bars2._M_t._M_impl._0_8_ = 0x100000002;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 3;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 4;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 2;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  bars1._M_t._M_impl._0_8_ = &bars2;
  Gudhi::persistence_matrix::
  Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>
  ::insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            ((Insertion_return *)&local_4b8,
             (Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>
              *)&m,7,(initializer_list<std::pair<unsigned_int,_unsigned_int>_> *)&bars1,-1);
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base(&local_4b8);
  bars2._M_t._M_impl._0_8_ = 0x100000003;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 5;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 4;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 2;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  bars1._M_t._M_impl._0_8_ = &bars2;
  Gudhi::persistence_matrix::
  Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>
  ::insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            ((Insertion_return *)&local_4d0,
             (Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>
              *)&m,8,(initializer_list<std::pair<unsigned_int,_unsigned_int>_> *)&bars1,-1);
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base(&local_4d0);
  bars2._M_t._M_impl._0_8_ = 0x100000002;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 5;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 4;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 2;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  bars1._M_t._M_impl._0_8_ = &bars2;
  Gudhi::persistence_matrix::
  Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>
  ::insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            ((Insertion_return *)&local_4e8,
             (Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>
              *)&m,9,(initializer_list<std::pair<unsigned_int,_unsigned_int>_> *)&bars1,-1);
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base(&local_4e8);
  bars1._M_t._M_impl._0_8_ = 0x100000007;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 8;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 1;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x400000009;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 3;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  bars2._M_t._M_impl._0_8_ = &bars1;
  Gudhi::persistence_matrix::
  Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>
  ::insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            ((Insertion_return *)&local_500,
             (Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>
              *)&m,10,(initializer_list<std::pair<unsigned_int,_unsigned_int>_> *)&bars2,-1);
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base(&local_500);
  bars1._M_t._M_impl._0_8_ = 0;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  Gudhi::persistence_matrix::
  Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>
  ::insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            ((Insertion_return *)&local_518,
             (Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>
              *)&m,0xb,(initializer_list<std::pair<unsigned_int,_unsigned_int>_> *)&bars1,0);
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base(&local_518);
  bars2._M_t._M_impl._0_8_ = 0x100000003;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 0xb;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 4;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 2;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  bars1._M_t._M_impl._0_8_ = (initializer_list<std::pair<unsigned_int,_unsigned_int>_> *)&bars2;
  Gudhi::persistence_matrix::
  Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>
  ::insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            ((Insertion_return *)&local_530,
             (Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>
              *)&m,0xd,(initializer_list<std::pair<unsigned_int,_unsigned_int>_> *)&bars1,-1);
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base(&local_530);
  reducedMatrix.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  reducedMatrix.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  reducedMatrix.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bars2._M_t._M_impl._0_8_ = 0x100000002;
  __l._M_len = 1;
  __l._M_array = (iterator)&bars2;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)&bars1,__l,(allocator_type *)&bars3);
  std::
  vector<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::allocator<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>>
  ::
  emplace_back<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((vector<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::allocator<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>>
              *)&reducedMatrix,
             (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              *)&bars1);
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base((_Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   *)&bars1);
  bars2._M_t._M_impl._0_8_ = 0x100000002;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 3;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 4;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&bars2;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)&bars1,__l_00,(allocator_type *)&bars3);
  std::
  vector<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::allocator<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>>
  ::
  emplace_back<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((vector<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::allocator<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>>
              *)&reducedMatrix,
             (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              *)&bars1);
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base((_Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   *)&bars1);
  bars2._M_t._M_impl._0_8_ = 0x100000002;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 5;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 4;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&bars2;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)&bars1,__l_01,(allocator_type *)&bars3);
  std::
  vector<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::allocator<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>>
  ::
  emplace_back<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((vector<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::allocator<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>>
              *)&reducedMatrix,
             (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              *)&bars1);
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base((_Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   *)&bars1);
  bars2._M_t._M_impl._0_8_ = 0x100000007;
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)&bars2;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)&bars1,__l_02,(allocator_type *)&bars3);
  std::
  vector<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::allocator<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>>
  ::
  emplace_back<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((vector<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::allocator<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>>
              *)&reducedMatrix,
             (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              *)&bars1);
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base((_Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   *)&bars1);
  bars2._M_t._M_impl._0_8_ = 0x100000007;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 8;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 1;
  __l_03._M_len = 2;
  __l_03._M_array = (iterator)&bars2;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)&bars1,__l_03,(allocator_type *)&bars3);
  std::
  vector<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::allocator<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>>
  ::
  emplace_back<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((vector<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::allocator<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>>
              *)&reducedMatrix,
             (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              *)&bars1);
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base((_Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   *)&bars1);
  bars2._M_t._M_impl._0_8_ = 0x100000007;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 8;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 1;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x400000009;
  __l_04._M_len = 3;
  __l_04._M_array = (iterator)&bars2;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)&bars1,__l_04,(allocator_type *)&bars3);
  std::
  vector<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::allocator<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>>
  ::
  emplace_back<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((vector<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::allocator<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>>
              *)&reducedMatrix,
             (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              *)&bars1);
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base((_Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   *)&bars1);
  bars2._M_t._M_impl._0_8_ = 0x10000000a;
  __l_05._M_len = 1;
  __l_05._M_array = (iterator)&bars2;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)&bars1,__l_05,(allocator_type *)&bars3);
  std::
  vector<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::allocator<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>>
  ::
  emplace_back<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((vector<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::allocator<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>>
              *)&reducedMatrix,
             (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              *)&bars1);
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base((_Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   *)&bars1);
  bars2._M_t._M_impl._0_8_ = 0x100000002;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 0xb;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 4;
  __l_06._M_len = 2;
  __l_06._M_array = (iterator)&bars2;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)&bars1,__l_06,(allocator_type *)&bars3);
  std::
  vector<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::allocator<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>>
  ::
  emplace_back<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((vector<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::allocator<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>>
              *)&reducedMatrix,
             (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              *)&bars1);
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base((_Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   *)&bars1);
  bars2._M_t._M_impl._0_8_ = 0x100000007;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 0xd;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 1;
  __l_07._M_len = 2;
  __l_07._M_array = (iterator)&bars2;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)&bars1,__l_07,(allocator_type *)&bars3);
  std::
  vector<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::allocator<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>>
  ::
  emplace_back<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((vector<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::allocator<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>>
              *)&reducedMatrix,
             (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              *)&bars1);
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base((_Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   *)&bars1);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>
            (&reducedMatrix,&m);
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars1._M_t._M_impl.super__Rb_tree_header._M_header;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       bars1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars1._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars2._M_t._M_impl.super__Rb_tree_header._M_header;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       bars2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars3._M_t._M_impl.super__Rb_tree_header._M_header;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars3._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var5 = m.matrix_.super_Chain_pairing_option.barcode_.
                super__List_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var1 = bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
      (Chain_pairing_option *)p_Var5 != &m.matrix_.super_Chain_pairing_option;
      p_Var5 = p_Var5->_M_next) {
    __args = p_Var5 + 1;
    __args_1 = (uint *)((long)&p_Var5[1]._M_next + 4);
    std::
    _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_shifted_barcode2<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
    ::_M_emplace_unique<int_const&,unsigned_int_const&,unsigned_int_const&>
              ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_shifted_barcode2<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                *)&bars1,(int *)__args,__args_1,(uint *)&p_Var5[1]._M_prev);
    std::
    _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_shifted_barcode2<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
    ::_M_emplace_unique<int_const&,unsigned_int_const&,unsigned_int_const&>
              ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_shifted_barcode2<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                *)&bars2,(int *)__args,__args_1,(uint *)&p_Var5[1]._M_prev);
    local_5e0[0] = *(uint *)&p_Var5[1]._M_prev;
    local_5e8 = (undefined **)__args->_M_next;
    std::
    _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_shifted_barcode2<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
    ::_M_emplace_unique<int&,unsigned_int&,unsigned_int&>
              ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_shifted_barcode2<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                *)&bars3,(int *)&local_5e8,(uint *)((long)&local_5e8 + 4),local_5e0);
  }
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x6ca);
  local_5e0[0] = local_5e0[0] & 0xffffff00;
  local_5e8 = &PTR__lazy_ostream_001fe050;
  local_5d8 = &boost::unit_test::lazy_ostream::inst;
  local_5d0 = (char **)0x1a84a2;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_58 = "";
  local_600[0] = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_5e8,&local_60,0x6ca,1,2,&p_Var1[1]._M_parent,"std::get<0>(*it)",local_600,"0");
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x6cb);
  local_5e0[0] = local_5e0[0] & 0xffffff00;
  local_5e8 = &PTR__lazy_ostream_001fe050;
  local_5d8 = &boost::unit_test::lazy_ostream::inst;
  local_5d0 = (char **)0x1a84a2;
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_88 = "";
  local_600[0] = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_5e8,&local_90,0x6cb,1,2,&p_Var1[1].field_0x4,"std::get<1>(*it)",local_600,"0");
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x6cd);
  local_5e0[0] = local_5e0[0] & 0xffffff00;
  local_5e8 = &PTR__lazy_ostream_001fe050;
  local_5d8 = &boost::unit_test::lazy_ostream::inst;
  local_5d0 = (char **)0x1a84a2;
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_b8 = "";
  local_600[0] = 0xffffffff;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_5e8,&local_c0,0x6cd,1,2,p_Var1 + 1,"std::get<2>(*it)",local_600,"-1");
  p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x6cf);
  local_5e0[0] = local_5e0[0] & 0xffffff00;
  local_5e8 = &PTR__lazy_ostream_001fe050;
  local_5d8 = &boost::unit_test::lazy_ostream::inst;
  local_5d0 = (char **)0x1a84a2;
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_e8 = "";
  local_600[0] = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_5e8,&local_f0,0x6cf,1,2,&p_Var3[1]._M_parent,"std::get<0>(*it)",local_600,"0");
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x6d0);
  local_5e0[0] = local_5e0[0] & 0xffffff00;
  local_5e8 = &PTR__lazy_ostream_001fe050;
  local_5d8 = &boost::unit_test::lazy_ostream::inst;
  local_5d0 = (char **)0x1a84a2;
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_118 = "";
  local_600[0] = 1;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_5e8,&local_120,0x6d0,1,2,&p_Var3[1].field_0x4,"std::get<1>(*it)",local_600,"1");
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_130,0x6d1);
  local_5e0[0] = local_5e0[0] & 0xffffff00;
  local_5e8 = &PTR__lazy_ostream_001fe050;
  local_5d8 = &boost::unit_test::lazy_ostream::inst;
  local_5d0 = (char **)0x1a84a2;
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_148 = "";
  local_600[0] = 3;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_5e8,&local_150,0x6d1,1,2,p_Var3 + 1,"std::get<2>(*it)",local_600,"3");
  p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x6d3);
  local_5e0[0] = local_5e0[0] & 0xffffff00;
  local_5e8 = &PTR__lazy_ostream_001fe050;
  local_5d8 = &boost::unit_test::lazy_ostream::inst;
  local_5d0 = (char **)0x1a84a2;
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_178 = "";
  local_600[0] = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_5e8,&local_180,0x6d3,1,2,&p_Var3[1]._M_parent,"std::get<0>(*it)",local_600,"0");
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_190,0x6d4);
  local_5e0[0] = local_5e0[0] & 0xffffff00;
  local_5e8 = &PTR__lazy_ostream_001fe050;
  local_5d8 = &boost::unit_test::lazy_ostream::inst;
  local_5d0 = (char **)0x1a84a2;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1a8 = "";
  local_600[0] = 2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_5e8,&local_1b0,0x6d4,1,2,&p_Var3[1].field_0x4,"std::get<1>(*it)",local_600,"2");
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c0,0x6d5);
  local_5e0[0] = local_5e0[0] & 0xffffff00;
  local_5e8 = &PTR__lazy_ostream_001fe050;
  local_5d8 = &boost::unit_test::lazy_ostream::inst;
  local_5d0 = (char **)0x1a84a2;
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1d8 = "";
  local_600[0] = 4;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_5e8,&local_1e0,0x6d5,1,2,p_Var3 + 1,"std::get<2>(*it)",local_600,"4");
  p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f0,0x6d7);
  local_5e0[0] = local_5e0[0] & 0xffffff00;
  local_5e8 = &PTR__lazy_ostream_001fe050;
  local_5d8 = &boost::unit_test::lazy_ostream::inst;
  local_5d0 = (char **)0x1a84a2;
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_208 = "";
  local_600[0] = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_5e8,&local_210,0x6d7,1,2,&p_Var3[1]._M_parent,"std::get<0>(*it)",local_600,"0");
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_220,0x6d8);
  local_5e0[0] = local_5e0[0] & 0xffffff00;
  local_5e8 = &PTR__lazy_ostream_001fe050;
  local_5d8 = &boost::unit_test::lazy_ostream::inst;
  local_5d0 = (char **)0x1a84a2;
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_238 = "";
  local_600[0] = 7;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_5e8,&local_240,0x6d8,1,2,&p_Var3[1].field_0x4,"std::get<1>(*it)",local_600,"7");
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_250,0x6d9);
  local_5e0[0] = local_5e0[0] & 0xffffff00;
  local_5e8 = &PTR__lazy_ostream_001fe050;
  local_5d8 = &boost::unit_test::lazy_ostream::inst;
  local_5d0 = (char **)0x1a84a2;
  local_270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_268 = "";
  local_600[0] = 8;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_5e8,&local_270,0x6d9,1,2,p_Var3 + 1,"std::get<2>(*it)",local_600,"8");
  p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_280,0x6db);
  local_5e0[0] = local_5e0[0] & 0xffffff00;
  local_5e8 = &PTR__lazy_ostream_001fe050;
  local_5d8 = &boost::unit_test::lazy_ostream::inst;
  local_5d0 = (char **)0x1a84a2;
  local_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_298 = "";
  local_600[0] = 1;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_5e8,&local_2a0,0x6db,1,2,&p_Var3[1]._M_parent,"std::get<0>(*it)",local_600,"1");
  local_2b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2b0,0x6dc);
  local_5e0[0] = local_5e0[0] & 0xffffff00;
  local_5e8 = &PTR__lazy_ostream_001fe050;
  local_5d8 = &boost::unit_test::lazy_ostream::inst;
  local_5d0 = (char **)0x1a84a2;
  local_2d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2c8 = "";
  local_600[0] = 5;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_5e8,&local_2d0,0x6dc,1,2,&p_Var3[1].field_0x4,"std::get<1>(*it)",local_600,"5");
  local_2e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2d8 = "";
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2e0,0x6dd);
  local_5e0[0] = local_5e0[0] & 0xffffff00;
  local_5e8 = &PTR__lazy_ostream_001fe050;
  local_5d8 = &boost::unit_test::lazy_ostream::inst;
  local_5d0 = (char **)0x1a84a2;
  local_300 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2f8 = "";
  local_600[0] = 6;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_5e8,&local_300,0x6dd,1,2,p_Var3 + 1,"std::get<2>(*it)",local_600,"6");
  puVar4 = (undefined1 *)std::_Rb_tree_increment(p_Var3);
  local_310 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_310,0x6df);
  local_5f8 = 0;
  sStack_5f0.pi_ = (sp_counted_base *)0x0;
  local_570 = "it == bars1.end()";
  local_568 = "";
  local_5e0[0] = local_5e0[0] & 0xffffff00;
  local_5e8 = &PTR__lazy_ostream_001fe250;
  local_5d8 = &boost::unit_test::lazy_ostream::inst;
  local_330 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_328 = "";
  local_5d0 = &local_570;
  local_600[0]._0_1_ = (_Rb_tree_header *)puVar4 == &bars1._M_t._M_impl.super__Rb_tree_header;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_5f0);
  local_340 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_338 = "";
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_340,0x6e1);
  local_600[0]._0_1_ = std::operator==(&bars1._M_t,&bars2._M_t);
  local_5f8 = 0;
  sStack_5f0.pi_ = (sp_counted_base *)0x0;
  local_570 = "bars1 == bars2";
  local_568 = "";
  local_5e0[0] = local_5e0[0] & 0xffffff00;
  local_5e8 = &PTR__lazy_ostream_001fe250;
  local_5d8 = &boost::unit_test::lazy_ostream::inst;
  local_360 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_358 = "";
  local_5d0 = &local_570;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_5f0);
  local_370 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_368 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_370,0x6e2);
  bVar2 = std::operator==(&bars1._M_t,&bars3._M_t);
  local_600[0] = CONCAT31(local_600[0]._1_3_,bVar2);
  local_5f8 = 0;
  sStack_5f0.pi_ = (sp_counted_base *)0x0;
  local_570 = "bars1 == bars3";
  local_568 = "";
  local_5e0[0] = local_5e0[0] & 0xffffff00;
  local_5e8 = &PTR__lazy_ostream_001fe250;
  local_5d8 = &boost::unit_test::lazy_ostream::inst;
  local_5d0 = &local_570;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_5f0);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars3._M_t);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars2._M_t);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars1._M_t);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector(&reducedMatrix);
  Gudhi::persistence_matrix::
  Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true>_>
  ::~Matrix(&m);
  return;
}

Assistant:

void test_shifted_barcode2() {
  using C = typename Matrix::Column;
  struct BarComp {
    bool operator()(const std::tuple<int, int, int>& c1, const std::tuple<int, int, int>& c2) const {
      if (std::get<0>(c1) != std::get<0>(c2)) return std::get<0>(c1) < std::get<0>(c2);
      if (std::get<1>(c1) != std::get<1>(c2)) return std::get<1>(c1) < std::get<1>(c2);
      return std::get<2>(c1) < std::get<2>(c2);
    }
  };

  Matrix m(9, 5);
  if constexpr (is_z2<C>()) {
    m.insert_boundary(2, {}, 0);
    m.insert_boundary(3, {}, 0);
    m.insert_boundary(5, {}, 0);
    m.insert_boundary(7, {2, 3});
    m.insert_boundary(8, {3, 5});
    m.insert_boundary(9, {2, 5});
    m.insert_boundary(10, {7, 8, 9});
    m.insert_boundary(11, {}, 0);
    m.insert_boundary(13, {3, 11});
  } else {
    m.insert_boundary(2, {}, 0);
    m.insert_boundary(3, {}, 0);
    m.insert_boundary(5, {}, 0);
    m.insert_boundary(7, {{2, 1}, {3, 4}});
    m.insert_boundary(8, {{3, 1}, {5, 4}});
    m.insert_boundary(9, {{2, 1}, {5, 4}});
    m.insert_boundary(10, {{7, 1}, {8, 1}, {9, 4}});
    m.insert_boundary(11, {}, 0);
    m.insert_boundary(13, {{3, 1}, {11, 4}});
  }

  const auto& barcode = m.get_current_barcode();

  std::vector<witness_content<C> > reducedMatrix;
  if constexpr (is_z2<C>()) {
    if constexpr (Matrix::Option_list::is_of_boundary_type) {
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.push_back({2, 3});
      reducedMatrix.push_back({3, 5});
      reducedMatrix.emplace_back();
      reducedMatrix.push_back({7, 8, 9});
      reducedMatrix.emplace_back();
      reducedMatrix.push_back({3, 11});
    } else {
      reducedMatrix.push_back({2});
      reducedMatrix.push_back({2, 3});
      reducedMatrix.push_back({2, 5});
      reducedMatrix.push_back({7});
      reducedMatrix.push_back({7, 8});
      reducedMatrix.push_back({7, 8, 9});
      reducedMatrix.push_back({10});
      reducedMatrix.push_back({2, 11});
      reducedMatrix.push_back({7, 13});
    }
  } else {
    if constexpr (Matrix::Option_list::is_of_boundary_type) {
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.push_back({{2, 1}, {3, 4}});
      reducedMatrix.push_back({{3, 1}, {5, 4}});
      reducedMatrix.emplace_back();
      reducedMatrix.push_back({{7, 1}, {8, 1}, {9, 4}});
      reducedMatrix.emplace_back();
      reducedMatrix.push_back({{3, 1}, {11, 4}});
    } else {
      reducedMatrix.push_back({{2, 1}});
      reducedMatrix.push_back({{2, 1}, {3, 4}});
      reducedMatrix.push_back({{2, 1}, {5, 4}});
      reducedMatrix.push_back({{7, 1}});
      reducedMatrix.push_back({{7, 1}, {8, 1}});
      reducedMatrix.push_back({{7, 1}, {8, 1}, {9, 4}});
      reducedMatrix.push_back({{10, 1}});
      reducedMatrix.push_back({{2, 1}, {11, 4}});
      reducedMatrix.push_back({{7, 1}, {13, 1}});
    }
  }
  if constexpr (Matrix::Option_list::column_indexation_type == Column_indexation_types::IDENTIFIER) {
    test_column_equality<C>(reducedMatrix[0], get_column_content_via_iterators(m.get_column(2)));
    test_column_equality<C>(reducedMatrix[1], get_column_content_via_iterators(m.get_column(3)));
    test_column_equality<C>(reducedMatrix[2], get_column_content_via_iterators(m.get_column(5)));
    test_column_equality<C>(reducedMatrix[3], get_column_content_via_iterators(m.get_column(7)));
    test_column_equality<C>(reducedMatrix[4], get_column_content_via_iterators(m.get_column(8)));
    test_column_equality<C>(reducedMatrix[5], get_column_content_via_iterators(m.get_column(9)));
    test_column_equality<C>(reducedMatrix[6], get_column_content_via_iterators(m.get_column(10)));
    test_column_equality<C>(reducedMatrix[7], get_column_content_via_iterators(m.get_column(11)));
    test_column_equality<C>(reducedMatrix[8], get_column_content_via_iterators(m.get_column(13)));
  } else {
    test_content_equality(reducedMatrix, m);
  }

  std::set<std::tuple<int, int, int>, BarComp> bars1;
  std::set<std::tuple<int, int, int>, BarComp> bars2;
  std::set<std::tuple<int, int, int>, BarComp> bars3;
  // bars are not ordered the same for all matrices
  for (auto it = barcode.begin(); it != barcode.end(); ++it) {
    // three access possibilities
    bars1.emplace(it->dim, it->birth, it->death);
    bars2.emplace(std::get<2>(*it), std::get<0>(*it), std::get<1>(*it));
    auto [x, y, z] = *it;
    bars3.emplace(z, x, y);
  }
  auto it = bars1.begin();
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 0);
  // TODO: verify why this -1 works...: it->death should be unsigned int, so double conversion
  BOOST_CHECK_EQUAL(std::get<2>(*it), -1);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 3);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 2);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 4);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 7);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 8);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 5);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 6);
  ++it;
  BOOST_CHECK(it == bars1.end());

  BOOST_CHECK(bars1 == bars2);
  BOOST_CHECK(bars1 == bars3);
}